

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

string * __thiscall base_uint<256u>::GetHex_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long in_FS_OFFSET;
  base_blob<256U> b;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 4) {
    WriteLE32((uchar *)((long)&local_48 + lVar1),*(uint32_t *)((long)this + lVar1));
  }
  base_blob<256u>::GetHex_abi_cxx11_(__return_storage_ptr__,(base_blob<256u> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string base_uint<BITS>::GetHex() const
{
    base_blob<BITS> b;
    for (int x = 0; x < this->WIDTH; ++x) {
        WriteLE32(b.begin() + x*4, this->pn[x]);
    }
    return b.GetHex();
}